

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

void createmeta(lua_State *L)

{
  lua_State *L_local;
  
  luaL_newmetatable(L,"FILE*");
  luaL_setfuncs(L,metameth,0);
  lua_createtable(L,0,7);
  luaL_setfuncs(L,meth,0);
  lua_setfield(L,-2,"__index");
  lua_settop(L,-2);
  return;
}

Assistant:

static void createmeta (lua_State *L) {
  luaL_newmetatable(L, LUA_FILEHANDLE);  /* metatable for file handles */
  luaL_setfuncs(L, metameth, 0);  /* add metamethods to new metatable */
  luaL_newlibtable(L, meth);  /* create method table */
  luaL_setfuncs(L, meth, 0);  /* add file methods to method table */
  lua_setfield(L, -2, "__index");  /* metatable.__index = method table */
  lua_pop(L, 1);  /* pop metatable */
}